

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

int __thiscall lzham::search_accelerator::init(search_accelerator *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  uint *__s;
  void *pvVar3;
  uint in_ECX;
  task_pool *in_RDX;
  uint in_R8D;
  uint in_R9D;
  byte in_stack_00000008;
  uint in_stack_00000010;
  bool grow_hint;
  uint local_3c;
  undefined1 local_1;
  
  if (in_stack_00000010 < 0x81) {
    local_3c = in_stack_00000010;
  }
  else {
    local_3c = 0x80;
  }
  this->m_max_probes = local_3c;
  this->m_pLZBase = (CLZBase *)ctx;
  if (in_ECX == 0) {
    in_RDX = (task_pool *)0x0;
  }
  this->m_pTask_pool = in_RDX;
  if (this->m_pTask_pool == (task_pool *)0x0) {
    in_ECX = 0;
  }
  this->m_max_helper_threads = in_ECX;
  if (this->m_max_probes < in_R9D) {
    in_R9D = this->m_max_probes;
  }
  this->m_max_matches = in_R9D;
  this->m_all_matches = (bool)(in_stack_00000008 & 1);
  this->m_max_dict_size = in_R8D;
  this->m_max_dict_size_mask = this->m_max_dict_size - 1;
  this->m_cur_dict_size = 0;
  this->m_lookahead_size = 0;
  this->m_lookahead_pos = 0;
  this->m_fill_lookahead_pos = 0;
  this->m_fill_lookahead_size = 0;
  this->m_fill_dict_size = 0;
  this->m_num_completed_helper_threads = 0;
  grow_hint = SUB41(in_R9D >> 0x18,0);
  bVar1 = vector<unsigned_char>::try_resize_no_construct
                    ((vector<unsigned_char> *)in_RDX,in_ECX,grow_hint);
  pvVar3 = (void *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    bVar1 = vector<unsigned_int>::try_resize_no_construct
                      ((vector<unsigned_int> *)in_RDX,in_ECX,grow_hint);
    pvVar3 = (void *)CONCAT71(extraout_var_00,bVar1);
    if (bVar1) {
      bVar1 = vector<lzham::node>::try_resize_no_construct
                        ((vector<lzham::node> *)in_RDX,in_ECX,grow_hint);
      pvVar3 = (void *)CONCAT71(extraout_var_01,bVar1);
      if (bVar1) {
        __s = vector<unsigned_int>::get_ptr(&this->m_hash);
        uVar2 = vector<unsigned_int>::size_in_bytes(&this->m_hash);
        pvVar3 = memset(__s,0,(ulong)uVar2);
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (int)CONCAT71((int7)((ulong)pvVar3 >> 8),local_1);
}

Assistant:

bool search_accelerator::init(CLZBase* pLZBase, task_pool* pPool, uint max_helper_threads, uint max_dict_size, uint max_matches, bool all_matches, uint max_probes)
   {
      LZHAM_ASSERT(pLZBase);
      LZHAM_ASSERT(max_dict_size && math::is_power_of_2(max_dict_size));
      LZHAM_ASSERT(max_probes);

      m_max_probes = LZHAM_MIN(cMatchAccelMaxSupportedProbes, max_probes);

      m_pLZBase = pLZBase;
      m_pTask_pool = max_helper_threads ? pPool : NULL;
      m_max_helper_threads = m_pTask_pool ? max_helper_threads : 0;
      m_max_matches = LZHAM_MIN(m_max_probes, max_matches);
      m_all_matches = all_matches;

      m_max_dict_size = max_dict_size;
      m_max_dict_size_mask = m_max_dict_size - 1;
      m_cur_dict_size = 0;
      m_lookahead_size = 0;
      m_lookahead_pos = 0;
      m_fill_lookahead_pos = 0;
      m_fill_lookahead_size = 0;
      m_fill_dict_size = 0;
      m_num_completed_helper_threads = 0;

      if (!m_dict.try_resize_no_construct(max_dict_size + CLZBase::cMaxMatchLen))
         return false;

      if (!m_hash.try_resize_no_construct(cHashSize))
         return false;

      if (!m_nodes.try_resize_no_construct(max_dict_size))
         return false;

      memset(m_hash.get_ptr(), 0, m_hash.size_in_bytes());

      return true;
   }